

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numDummyAttributes)

{
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *this_00;
  char *pcVar1;
  ProgramLibrary *this_01;
  undefined8 vtxShaderSource_;
  int i;
  long *plVar2;
  undefined8 *puVar3;
  mapped_type *pmVar4;
  long lVar5;
  ulong *puVar6;
  size_type *psVar7;
  long *plVar8;
  ulong uVar9;
  int iVar10;
  string vtxColorExpr;
  ProgramContext *context;
  string vtxDummyInputs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  firstLevelParams;
  key_type local_358;
  int local_334;
  string local_330;
  Vector<float,_4> local_310;
  ulong local_300;
  long lStack_2f8;
  ProgramContext *local_2f0;
  ProgramLibrary *local_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  undefined1 *local_2a0;
  undefined8 local_298;
  undefined1 local_290;
  undefined7 uStack_28f;
  VarSpec local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar10 = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_280.name._M_dataplus._M_p = (pointer)&local_280.name.field_2;
  local_280.name._M_string_length = 0;
  local_280.name.field_2._M_local_buf[0] = '\0';
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_string_length = 0;
  local_330.field_2._M_allocated_capacity =
       local_330.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_334 = numDummyAttributes;
  local_2f0 = __return_storage_ptr__;
  local_2e8 = this;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numDummyAttributes) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,0x1cf4238);
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_300 = *puVar6;
        lStack_2f8 = plVar2[3];
        local_310.m_data._0_8_ = &local_300;
      }
      else {
        local_300 = *puVar6;
        local_310.m_data._0_8_ = (ulong *)*plVar2;
      }
      local_310.m_data._8_8_ = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_310);
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      psVar7 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_358.field_2._M_allocated_capacity = *psVar7;
        local_358.field_2._8_8_ = plVar2[3];
      }
      else {
        local_358.field_2._M_allocated_capacity = *psVar7;
        local_358._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_358._M_string_length = plVar2[1];
      *plVar2 = (long)psVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_358._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((ulong *)local_310.m_data._0_8_ != &local_300) {
        operator_delete((void *)local_310.m_data._0_8_,local_300 + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      local_2a0 = &local_290;
      local_298 = 0;
      local_290 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      plVar8 = plVar2 + 2;
      if ((long *)*plVar2 == plVar8) {
        local_2d0 = *plVar8;
        lStack_2c8 = plVar2[3];
        local_2e0 = &local_2d0;
      }
      else {
        local_2d0 = *plVar8;
        local_2e0 = (long *)*plVar2;
      }
      local_2d8 = plVar2[1];
      *plVar2 = (long)plVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_2e0);
      puVar6 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar6) {
        local_300 = *puVar6;
        lStack_2f8 = plVar2[3];
        local_310.m_data._0_8_ = &local_300;
      }
      else {
        local_300 = *puVar6;
        local_310.m_data._0_8_ = (ulong *)*plVar2;
      }
      local_310.m_data._8_8_ = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      uVar9 = 0xf;
      if ((ulong *)local_310.m_data._0_8_ != &local_300) {
        uVar9 = local_300;
      }
      if (uVar9 < (ulong)(local_2b8 + local_310.m_data._8_8_)) {
        uVar9 = 0xf;
        if (local_2c0 != local_2b0) {
          uVar9 = local_2b0[0];
        }
        if (uVar9 < (ulong)(local_2b8 + local_310.m_data._8_8_)) goto LAB_0184901c;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2c0,0,(char *)0x0,local_310.m_data._0_8_);
      }
      else {
LAB_0184901c:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_2c0);
      }
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      psVar7 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_358.field_2._M_allocated_capacity = *psVar7;
        local_358.field_2._8_8_ = puVar3[3];
      }
      else {
        local_358.field_2._M_allocated_capacity = *psVar7;
        local_358._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_358._M_string_length = puVar3[1];
      *puVar3 = psVar7;
      puVar3[1] = 0;
      *(undefined1 *)psVar7 = 0;
      std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_358._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if (local_2c0 != local_2b0) {
        operator_delete(local_2c0,local_2b0[0] + 1);
      }
      if ((ulong *)local_310.m_data._0_8_ != &local_300) {
        operator_delete((void *)local_310.m_data._0_8_,local_300 + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,CONCAT71(uStack_28f,local_290) + 1);
      }
      iVar10 = iVar10 + 1;
    } while (local_334 != iVar10);
  }
  this_01 = local_2e8;
  substitute((string *)local_1a8,local_2e8,&local_280.name);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"VTX_DUMMY_INPUTS","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1d8,&local_358);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_1a8 + 0x10;
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"VTX_COLOR_EXPRESSION","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_1d8,(key_type *)local_1a8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
    operator_delete(local_280.name._M_dataplus._M_p,
                    CONCAT71(local_280.name.field_2._M_allocated_capacity._1_7_,
                             local_280.name.field_2._M_local_buf[0]) + 1);
  }
  local_280.name._M_dataplus._M_p = (pointer)&local_280.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_DUMMY_INPUTS}${VTX_OUT} mediump vec4 v_color;\n\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n\tv_color = ${VTX_COLOR_EXPRESSION};\n}\n"
             ,"");
  substitute((string *)local_1a8,this_01,&local_280.name,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1d8);
  vtxShaderSource_ = local_1a8._0_8_;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_358,
             "${FRAG_HEADER}${FRAG_IN} mediump vec4 v_color;\n\nvoid main (void)\n{\n\t${FRAG_COLOR} = v_color;\n}\n"
             ,"");
  substitute(&local_330,this_01,&local_358);
  ProgramContext::ProgramContext
            (local_2f0,(char *)vtxShaderSource_,local_330._M_dataplus._M_p,"a_position");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
    operator_delete(local_280.name._M_dataplus._M_p,
                    CONCAT71(local_280.name.field_2._M_allocated_capacity._1_7_,
                             local_280.name.field_2._M_local_buf[0]) + 1);
  }
  local_280.name._M_dataplus._M_p = (pointer)&local_280.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"a_position","");
  this_00 = &local_2f0->attributes;
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&local_330._M_dataplus._M_p + lVar5 * 4) = 0xbdcccccd;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&local_358._M_dataplus._M_p + lVar5 * 4) = 0x3dcccccd;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_1a8,&local_280.name,(Vector<float,_3> *)&local_330,
             (Vector<float,_3> *)&local_358);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(this_00,(VarSpec *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
    operator_delete(local_280.name._M_dataplus._M_p,
                    CONCAT71(local_280.name.field_2._M_allocated_capacity._1_7_,
                             local_280.name.field_2._M_local_buf[0]) + 1);
  }
  if (0 < local_334) {
    local_2e8 = (ProgramLibrary *)CONCAT44(local_2e8._4_4_,1.0 / (float)local_334);
    iVar10 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x1cf424f);
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      puVar6 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_330.field_2._M_allocated_capacity = *puVar6;
        local_330.field_2._8_8_ = plVar2[3];
      }
      else {
        local_330.field_2._M_allocated_capacity = *puVar6;
        local_330._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_330._M_string_length = plVar2[1];
      *plVar2 = (long)puVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_1a8._0_8_ = (char *)0x0;
      local_1a8._8_8_ = 0;
      lVar5 = 0;
      do {
        local_310.m_data[lVar5] = local_2e8._0_4_;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      VarSpec::VarSpec<tcu::Vector<float,4>>
                (&local_280,&local_330,(Vector<float,_4> *)local_1a8,&local_310);
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
      emplace_back<deqp::gls::VarSpec>(this_00,&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.name._M_dataplus._M_p != &local_280.name.field_2) {
        operator_delete(local_280.name._M_dataplus._M_p,
                        CONCAT71(local_280.name.field_2._M_allocated_capacity._1_7_,
                                 local_280.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != local_334);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1d8);
  return local_2f0;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateBufferContext (const int numDummyAttributes) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_DUMMY_INPUTS}"
		"${VTX_OUT} mediump vec4 v_color;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 1.0);\n"
		"	v_color = ${VTX_COLOR_EXPRESSION};\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_IN} mediump vec4 v_color;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} = v_color;\n"
		"}\n";

	map<string, string> firstLevelParams;

	{
		string vtxDummyInputs;
		string vtxColorExpr;
		for (int i = 0; i < numDummyAttributes; i++)
		{
			vtxDummyInputs	+= "${VTX_IN} mediump vec4 a_in" + toString(i) + ";\n";
			vtxColorExpr	+= string() + (i > 0 ? " + " : "") + "a_in" + toString(i);
		}

		firstLevelParams["VTX_DUMMY_INPUTS"]		= substitute(vtxDummyInputs);
		firstLevelParams["VTX_COLOR_EXPRESSION"]	= vtxColorExpr;
	}

	gls::ProgramContext context(substitute(vertexTemplate, firstLevelParams).c_str(), substitute(fragmentTemplate).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position", Vec3(-0.1f), Vec3(0.1f)));

	for (int i = 0; i < numDummyAttributes; i++)
		context.attributes.push_back(gls::VarSpec("a_in" + de::toString(i), Vec4(0.0f), Vec4(1.0f / (float)numDummyAttributes)));

	return context;
}